

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copy.cpp
# Opt level: O2

void __thiscall ObserverManager_Copy1_Test::TestBody(ObserverManager_Copy1_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  AssertionResult gtest_ar;
  A a2;
  A a1;
  stringstream out;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  std::__cxx11::string::string((string *)&a2,"A",(allocator *)&local_230);
  A::A(&a1,local_180,(string *)&a2);
  std::__cxx11::string::~string((string *)&a2);
  ObserverManager::subscribe<FooBarProtocol,A>(&a1);
  A::A(&a2,&a1);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"A \"","out.str()",(char (*) [3])0x14b793,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x1f,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_238,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&AStack_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_230);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ObserverManager::subscribe<FooBarProtocol,A>(&a2);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"A A A \"","out.str()",(char (*) [7])"A A A ",&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_230);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x24,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_238,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&AStack_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_230);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  A::~A(&a2);
  A::~A(&a1);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&a2,"\"A A A \"","out.str()",(char (*) [7])"A A A ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a1);
  std::__cxx11::string::~string((string *)&a1);
  if ((char)a2.super_FooBarProtocol.super_BaseObserverProtocol._vptr_BaseObserverProtocol == '\0') {
    testing::Message::Message((Message *)&a1);
    if (a2.super_FooBarProtocol.super_BaseObserverProtocol.observerId == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)a2.super_FooBarProtocol.super_BaseObserverProtocol.observerId;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x28,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&a1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&a1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a2.super_FooBarProtocol.super_BaseObserverProtocol.observerId);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return;
}

Assistant:

TEST(ObserverManager, Copy1) {
    std::stringstream out;

    {
        A a1(out, "A");
        ObserverManager::subscribe<FooBarProtocol>(&a1);

        A a2(a1);

        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A ", out.str());

        ObserverManager::subscribe<FooBarProtocol>(&a2);

        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A A A ", out.str());
    }

    ObserverManager::notify(&FooBarProtocol::foo);
    EXPECT_EQ("A A A ", out.str());
}